

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O0

void RansDecRenorm(RansState *r,uint8_t **pptr)

{
  byte *pbVar1;
  byte *local_28;
  uint8_t *ptr;
  uint32_t x;
  uint8_t **pptr_local;
  RansState *r_local;
  
  ptr._4_4_ = *r;
  if (ptr._4_4_ < 0x800000) {
    local_28 = *pptr;
    do {
      pbVar1 = local_28 + 1;
      ptr._4_4_ = ptr._4_4_ << 8 | (uint)*local_28;
      local_28 = pbVar1;
    } while (ptr._4_4_ < 0x800000);
    *pptr = pbVar1;
  }
  *r = ptr._4_4_;
  return;
}

Assistant:

static inline void RansDecRenorm(RansState* r, uint8_t** pptr)
{
    // renormalize
    uint32_t x = *r;

    if (x < RANS_BYTE_L) {
        uint8_t* ptr = *pptr;
        do x = (x << 8) | *ptr++; while (x < RANS_BYTE_L);
        *pptr = ptr;
    }

    *r = x;
}